

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

bool __thiscall
cmQtAutoMocUic::JobEvaluateT::MocEvalSource(JobEvaluateT *this,SourceFileHandleT *source)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte bVar1;
  element_type *peVar2;
  element_type *text;
  pointer pIVar3;
  SourceFileHandleT *pSVar4;
  __type _Var5;
  bool bVar6;
  pointer pIVar7;
  pointer pIVar8;
  pointer pIVar9;
  IncludeKeyT *incKey;
  bool bVar10;
  pointer local_1f8;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  element_type *local_1a8;
  string emsg;
  SourceFileHandleT header_1;
  SourceFileHandleT header;
  string sourceBase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  SourceFileHandleT local_f8;
  SourceFileHandleT local_e8;
  __shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2> local_60;
  string sourceDir;
  
  peVar2 = (source->super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if ((peVar2->Moc != true) ||
     (((text = (peVar2->ParseData).
               super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, *(size_type *)((long)&(text->Moc).Macro + 8) == 0 &&
       (*(pointer *)
         &(text->Moc).Include.Underscore.
          super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
          ._M_impl == *(pointer *)((long)&(text->Moc).Include + 8))) &&
      (*(pointer *)((long)&(text->Moc).Include + 0x18) ==
       *(pointer *)((long)&(text->Moc).Include + 0x20))))) {
    return true;
  }
  cmQtAutoGen::SubDirPrefix(&sourceDir,&peVar2->FileName);
  local_1a8 = peVar2;
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&sourceBase,&peVar2->FileName);
  bVar1 = *(byte *)((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ + 0x272);
  bVar10 = true;
  if (bVar1 == 1) {
    pIVar9 = *(pointer *)
              &(text->Moc).Include.Underscore.
               super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
               ._M_impl;
    pIVar8 = *(pointer *)((long)&(text->Moc).Include + 8);
    do {
      bVar10 = pIVar9 == pIVar8;
      if (bVar10) break;
      _Var5 = std::operator==(&pIVar9->Base,&sourceBase);
      pIVar9 = pIVar9 + 1;
    } while (!_Var5);
  }
  pIVar9 = *(pointer *)((long)&(text->Moc).Include + 0x20);
  pIVar8 = *(pointer *)((long)&(text->Moc).Include + 0x18);
  do {
    pIVar7 = pIVar8;
    if (pIVar7 == pIVar9) {
      if (((byte)(bVar10 | bVar1 ^ 1) == 1) && (*(size_type *)((long)&(text->Moc).Macro + 8) != 0))
      {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&emsg,"The file contains a ",(allocator<char> *)&msg);
        cmQtAutoGen::Quoted(&msg,(string *)text);
        peVar2 = local_1a8;
        std::__cxx11::string::append((string *)&emsg);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::append((char *)&emsg);
        std::operator+(&local_1c8,&sourceBase,".moc");
        cmQtAutoGen::Quoted(&msg,&local_1c8);
        std::__cxx11::string::append((string *)&emsg);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::append((char *)&emsg);
        std::__cxx11::string::append((string *)&emsg);
        std::__cxx11::string::append((char *)&emsg);
        JobT::LogFileError((JobT *)this,MOC,&peVar2->FileName,&emsg);
        goto LAB_001807f5;
      }
      break;
    }
    _Var5 = std::operator==(&pIVar7->Base,&sourceBase);
    pIVar8 = pIVar7 + 1;
  } while (!_Var5);
  pIVar3 = *(pointer *)((long)&(text->Moc).Include + 8);
  for (pIVar8 = *(pointer *)
                 &(text->Moc).Include.Underscore.
                  super__Vector_base<cmQtAutoMocUic::IncludeKeyT,_std::allocator<cmQtAutoMocUic::IncludeKeyT>_>
                  ._M_impl; pIVar8 != pIVar3; pIVar8 = pIVar8 + 1) {
    std::operator+(&emsg,&pIVar8->Dir,&pIVar8->Base);
    MocFindIncludedHeader((JobEvaluateT *)&header,(string *)this,&sourceDir);
    if (header.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"The file includes the moc file ",(allocator<char> *)&local_1c8);
      cmQtAutoGen::Quoted(&local_1c8,&pIVar8->Key);
      peVar2 = local_1a8;
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::append((char *)&msg);
      MocMessageTestHeaders(&local_1c8,this,&emsg);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&local_1c8);
      JobT::LogFileError((JobT *)this,MOC,&peVar2->FileName,&msg);
      std::__cxx11::string::~string((string *)&msg);
LAB_001807e8:
      pSVar4 = &header;
      goto LAB_001807f0;
    }
    if ((((pIVar7 == pIVar9 & bVar1) == 0) || (*(size_type *)((long)&(text->Moc).Macro + 8) == 0))
       || (_Var5 = std::operator==(&pIVar8->Base,&sourceBase), !_Var5)) {
      bVar10 = MocSettingsT::skipped
                         ((MocSettingsT *)
                          ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                          0x270),&(header.
                                   super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->FileName);
      if (!bVar10) {
        std::__shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,
                   &source->
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>);
        local_e8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = header.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
        local_e8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             header.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        header.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        header.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar10 = MocRegisterIncluded(this,&pIVar8->Key,(SourceFileHandleT *)&local_80,&local_e8,true
                                    );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e8.
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        goto joined_r0x00180227;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"The file contains a ",(allocator<char> *)&local_1c8);
      cmQtAutoGen::Quoted(&local_1c8,(string *)text);
      peVar2 = local_1a8;
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::append((char *)&msg);
      std::operator+(&local_118,&sourceBase,".moc");
      cmQtAutoGen::Quoted(&local_1c8,&local_118);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::append((char *)&msg);
      cmQtAutoGen::Quoted(&local_1c8,&pIVar8->Key);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::append((char *)&msg);
      cmQtAutoGen::Quoted(&local_1c8,&peVar2->FileName);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::append((char *)&msg);
      std::operator+(&local_118,&sourceBase,".moc");
      cmQtAutoGen::Quoted(&local_1c8,&local_118);
      std::__cxx11::string::append((string *)&msg);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::append((char *)&msg);
      std::__cxx11::string::append((char *)&msg);
      cmQtAutoGenerator::Logger::WarningFile
                ((Logger *)
                 ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ + 0x70),MOC
                 ,&peVar2->FileName,&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::__shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,
                 &source->
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,
                 &source->
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>);
      bVar10 = MocRegisterIncluded(this,&pIVar8->Key,(SourceFileHandleT *)&local_60,
                                   (SourceFileHandleT *)&local_70,false);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
joined_r0x00180227:
      if (!bVar10) goto LAB_001807e8;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&header.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&emsg);
  }
  local_1f8 = *(pointer *)((long)&(text->Moc).Include + 0x18);
  pIVar9 = *(pointer *)((long)&(text->Moc).Include + 0x20);
  if (bVar1 != 0) {
LAB_00180273:
    bVar10 = local_1f8 == pIVar9;
    if (!bVar10) {
      __lhs = &local_1f8->Base;
      _Var5 = std::operator==(__lhs,&sourceBase);
      if ((!_Var5) || (*(size_type *)((long)&(text->Moc).Macro + 8) == 0)) {
        std::operator+(&emsg,&local_1f8->Dir,__lhs);
        MocFindIncludedHeader((JobEvaluateT *)&header_1,(string *)this,&sourceDir);
        if (header_1.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          bVar10 = MocSettingsT::skipped
                             ((MocSettingsT *)
                              ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->
                                     UserData_ + 0x270),
                              &(header_1.
                                super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->FileName);
          if (!bVar10) {
            if ((_Var5) && (*(size_type *)((long)&(text->Moc).Macro + 8) == 0)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msg,"The file includes the moc file ",
                         (allocator<char> *)&local_1c8);
              cmQtAutoGen::Quoted(&local_1c8,&local_1f8->Key);
              std::__cxx11::string::append((string *)&msg);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::append((char *)&msg);
              MocSettingsT::MacrosString_abi_cxx11_
                        (&local_1c8,
                         (MocSettingsT *)
                         ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                         0x270));
              std::__cxx11::string::append((string *)&msg);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::append((char *)&msg);
              cmQtAutoGen::Quoted(&local_1c8,
                                  &(header_1.
                                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->FileName);
              std::__cxx11::string::append((string *)&msg);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::append((char *)&msg);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &header,"moc_",__lhs);
              std::operator+(&local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &header,".cpp");
              cmQtAutoGen::Quoted(&local_1c8,&local_118);
              std::__cxx11::string::append((string *)&msg);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&header);
              std::__cxx11::string::append((char *)&msg);
              std::__cxx11::string::append((char *)&msg);
              cmQtAutoGenerator::Logger::WarningFile
                        ((Logger *)
                         ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                         0x70),MOC,&local_1a8->FileName,&msg);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msg,"The file includes the moc file ",
                         (allocator<char> *)&local_1c8);
              cmQtAutoGen::Quoted(&local_1c8,&local_1f8->Key);
              std::__cxx11::string::append((string *)&msg);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::append((char *)&msg);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &header,"moc_",__lhs);
              std::operator+(&local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &header,".cpp");
              cmQtAutoGen::Quoted(&local_1c8,&local_118);
              std::__cxx11::string::append((string *)&msg);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&header);
              std::__cxx11::string::append((char *)&msg);
              cmQtAutoGen::Quoted(&local_1c8,
                                  &(header_1.
                                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->FileName);
              std::__cxx11::string::append((string *)&msg);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::append((char *)&msg);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &header,"moc_",__lhs);
              std::operator+(&local_118,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &header,".cpp");
              cmQtAutoGen::Quoted(&local_1c8,&local_118);
              std::__cxx11::string::append((string *)&msg);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&header);
              std::__cxx11::string::append((char *)&msg);
              std::__cxx11::string::append((char *)&msg);
              cmQtAutoGenerator::Logger::WarningFile
                        ((Logger *)
                         ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                         0x70),MOC,&local_1a8->FileName,&msg);
            }
            std::__cxx11::string::~string((string *)&msg);
            std::__shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_b0,
                       &source->
                        super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>)
            ;
            local_f8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = header_1.
                     super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_f8.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 header_1.
                 super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            header_1.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            header_1.super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar10 = MocRegisterIncluded(this,&local_1f8->Key,(SourceFileHandleT *)&local_b0,
                                         &local_f8,true);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_f8.
                        super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
            if (!bVar10) goto LAB_00180b0a;
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&header_1.
                      super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)&emsg);
          goto LAB_001805df;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"The file includes the moc file ",(allocator<char> *)&local_1c8);
        cmQtAutoGen::Quoted(&local_1c8,&local_1f8->Key);
        peVar2 = local_1a8;
        std::__cxx11::string::append((string *)&msg);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::append((char *)&msg);
        MocMessageTestHeaders(&local_1c8,this,&emsg);
        std::__cxx11::string::append((string *)&msg);
        std::__cxx11::string::~string((string *)&local_1c8);
        JobT::LogFileError((JobT *)this,MOC,&peVar2->FileName,&msg);
        std::__cxx11::string::~string((string *)&msg);
LAB_00180b0a:
        pSVar4 = &header_1;
LAB_001807f0:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&(pSVar4->
                    super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        goto LAB_001807f5;
      }
      std::__shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,
                 &source->
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a0,
                 &source->
                  super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>);
      bVar6 = MocRegisterIncluded(this,&local_1f8->Key,(SourceFileHandleT *)&local_90,
                                  (SourceFileHandleT *)&local_a0,false);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      if (bVar6) goto LAB_001805df;
    }
    goto LAB_00180802;
  }
  while( true ) {
    bVar10 = local_1f8 == pIVar9;
    if (bVar10) goto LAB_00180802;
    _Var5 = std::operator==(&local_1f8->Base,&sourceBase);
    if (!_Var5) break;
    if (*(size_type *)((long)&(text->Moc).Macro + 8) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&emsg,"The file includes the moc file ",(allocator<char> *)&msg);
      cmQtAutoGen::Quoted(&msg,&local_1f8->Key);
      std::__cxx11::string::append((string *)&emsg);
      peVar2 = local_1a8;
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::append((char *)&emsg);
      MocSettingsT::MacrosString_abi_cxx11_
                (&msg,(MocSettingsT *)
                      ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ +
                      0x270));
      std::__cxx11::string::append((string *)&emsg);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::append((char *)&emsg);
      cmQtAutoGenerator::Logger::WarningFile
                ((Logger *)
                 ((long)((this->super_JobFenceT).super_JobT.super_JobT.Pool_)->UserData_ + 0x70),MOC
                 ,&peVar2->FileName,&emsg);
      std::__cxx11::string::~string((string *)&emsg);
    }
    std::__shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c0,
               &source->super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::__shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_d0,
               &source->super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>)
    ;
    bVar6 = MocRegisterIncluded(this,&local_1f8->Key,(SourceFileHandleT *)&local_c0,
                                (SourceFileHandleT *)&local_d0,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    if (!bVar6) goto LAB_00180802;
    local_1f8 = local_1f8 + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emsg,"The file includes the moc file ",(allocator<char> *)&msg);
  cmQtAutoGen::Quoted(&msg,&local_1f8->Key);
  peVar2 = local_1a8;
  std::__cxx11::string::append((string *)&emsg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::append((char *)&emsg);
  std::operator+(&local_1c8,&sourceBase,".moc");
  cmQtAutoGen::Quoted(&msg,&local_1c8);
  std::__cxx11::string::append((string *)&emsg);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::append((char *)&emsg);
  JobT::LogFileError((JobT *)this,MOC,&peVar2->FileName,&emsg);
LAB_001807f5:
  std::__cxx11::string::~string((string *)&emsg);
  bVar10 = false;
LAB_00180802:
  std::__cxx11::string::~string((string *)&sourceBase);
  std::__cxx11::string::~string((string *)&sourceDir);
  return bVar10;
LAB_001805df:
  local_1f8 = local_1f8 + 1;
  goto LAB_00180273;
}

Assistant:

bool cmQtAutoMocUic::JobEvaluateT::MocEvalSource(
  SourceFileHandleT const& source)
{
  SourceFileT const& sourceFile = *source;
  auto const& parseData = sourceFile.ParseData->Moc;
  if (!sourceFile.Moc ||
      (parseData.Macro.empty() && parseData.Include.Underscore.empty() &&
       parseData.Include.Dot.empty())) {
    return true;
  }

  std::string const sourceDir = SubDirPrefix(sourceFile.FileName);
  std::string const sourceBase =
    cmSystemTools::GetFilenameWithoutLastExtension(sourceFile.FileName);

  // For relaxed mode check if the own "moc_" or ".moc" file is included
  bool const relaxedMode = MocConst().RelaxedMode;
  bool sourceIncludesMocUnderscore = false;
  bool sourceIncludesDotMoc = false;
  // Check if the sources own "moc_" or ".moc" file is included
  if (relaxedMode) {
    for (IncludeKeyT const& incKey : parseData.Include.Underscore) {
      if (incKey.Base == sourceBase) {
        sourceIncludesMocUnderscore = true;
        break;
      }
    }
  }
  for (IncludeKeyT const& incKey : parseData.Include.Dot) {
    if (incKey.Base == sourceBase) {
      sourceIncludesDotMoc = true;
      break;
    }
  }

  // Check if this source needs to be moc processed but doesn't.
  if (!sourceIncludesDotMoc && !parseData.Macro.empty() &&
      !(relaxedMode && sourceIncludesMocUnderscore)) {
    {
      std::string emsg = "The file contains a ";
      emsg += Quoted(parseData.Macro);
      emsg += " macro, but does not include ";
      emsg += Quoted(sourceBase + ".moc");
      emsg += "!\nConsider to\n  - add #include \"";
      emsg += sourceBase;
      emsg += ".moc\"\n  - enable SKIP_AUTOMOC for this file";
      LogFileError(GenT::MOC, sourceFile.FileName, emsg);
    }
    return false;
  }

  // Evaluate "moc_" includes
  for (IncludeKeyT const& incKey : parseData.Include.Underscore) {
    std::string const headerBase = incKey.Dir + incKey.Base;
    SourceFileHandleT header = MocFindIncludedHeader(sourceDir, headerBase);
    if (!header) {
      {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nbut the header could not be found "
               "in the following locations\n";
        msg += MocMessageTestHeaders(headerBase);
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
      }
      return false;
    }
    // The include might be handled differently in relaxed mode
    if (relaxedMode && !sourceIncludesDotMoc && !parseData.Macro.empty() &&
        (incKey.Base == sourceBase)) {
      // The <BASE>.cpp file includes a Qt macro but does not include the
      // <BASE>.moc file. In this case, the moc_<BASE>.cpp should probably
      // be generated from <BASE>.cpp instead of <BASE>.h, because otherwise
      // it won't build. But warn, since this is not how it is supposed to be
      // used. This is for KDE4 compatibility.
      {
        // Issue a warning
        std::string msg = "The file contains a ";
        msg += Quoted(parseData.Macro);
        msg += " macro, but does not include ";
        msg += Quoted(sourceBase + ".moc");
        msg += ".\nInstead it includes ";
        msg += Quoted(incKey.Key);
        msg += ".\nRunning moc on the source\n  ";
        msg += Quoted(sourceFile.FileName);
        msg += "!\nBetter include ";
        msg += Quoted(sourceBase + ".moc");
        msg += " for compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
        return false;
      }
      continue;
    }

    // Check if header is skipped
    if (MocConst().skipped(header->FileName)) {
      continue;
    }
    // Create mapping
    if (!MocRegisterIncluded(incKey.Key, source, std::move(header), true)) {
      return false;
    }
  }

  // Evaluate ".moc" includes
  if (relaxedMode) {
    // Relaxed mode
    for (IncludeKeyT const& incKey : parseData.Include.Dot) {
      // Check if this is the sources own .moc file
      bool const ownMoc = (incKey.Base == sourceBase);
      if (ownMoc && !parseData.Macro.empty()) {
        // Create mapping for the regular use case
        if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
          return false;
        }
        continue;
      }
      // Try to find a header instead but issue a warning.
      // This is for KDE4 compatibility.
      std::string const headerBase = incKey.Dir + incKey.Base;
      SourceFileHandleT header = MocFindIncludedHeader(sourceDir, headerBase);
      if (!header) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nwhich seems to be the moc file from a different source "
               "file.\nCMAKE_AUTOMOC_RELAXED_MODE: Also a matching header"
               "could not be found in the following locations\n";
        msg += MocMessageTestHeaders(headerBase);
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
        return false;
      }
      // Check if header is skipped
      if (MocConst().skipped(header->FileName)) {
        continue;
      }
      // Issue a warning
      if (ownMoc && parseData.Macro.empty()) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ", but does not contain a\n";
        msg += MocConst().MacrosString();
        msg += " macro.\nRunning moc on the header\n  ";
        msg += Quoted(header->FileName);
        msg += "!\nBetter include ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += " for a compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      } else {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += " instead of ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += ".\nRunning moc on the header\n  ";
        msg += Quoted(header->FileName);
        msg += "!\nBetter include ";
        msg += Quoted("moc_" + incKey.Base + ".cpp");
        msg += " for compatibility with regular mode.\n";
        msg += "This is a CMAKE_AUTOMOC_RELAXED_MODE warning.\n";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, std::move(header), true)) {
        return false;
      }
    }
  } else {
    // Strict mode
    for (IncludeKeyT const& incKey : parseData.Include.Dot) {
      // Check if this is the sources own .moc file
      bool const ownMoc = (incKey.Base == sourceBase);
      if (!ownMoc) {
        // Don't allow <BASE>.moc include other than own in regular mode
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ",\nwhich seems to be the moc file from a different "
               "source file.\nThis is not supported.  Include ";
        msg += Quoted(sourceBase + ".moc");
        msg += " to run moc on this source file.";
        LogFileError(GenT::MOC, sourceFile.FileName, msg);
        return false;
      }
      // Accept but issue a warning if moc isn't required
      if (parseData.Macro.empty()) {
        std::string msg = "The file includes the moc file ";
        msg += Quoted(incKey.Key);
        msg += ", but does not contain a ";
        msg += MocConst().MacrosString();
        msg += " macro.";
        Log().WarningFile(GenT::MOC, sourceFile.FileName, msg);
      }
      // Create mapping
      if (!MocRegisterIncluded(incKey.Key, source, source, false)) {
        return false;
      }
    }
  }

  return true;
}